

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.hpp
# Opt level: O0

matrix4x4_t<float> *
yama::matrix4x4_t<float>::scaling
          (matrix4x4_t<float> *__return_storage_ptr__,value_type_conflict1 *x,
          value_type_conflict1 *y,value_type_conflict1 *z)

{
  type_conflict tVar1;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  value_type_conflict1 *local_48;
  value_type_conflict1 *z_local;
  value_type_conflict1 *y_local;
  value_type_conflict1 *x_local;
  
  local_4c = 0.0;
  local_48 = z;
  z_local = y;
  y_local = x;
  tVar1 = close<float>(x,&local_4c,&constants_t<float>::EPSILON);
  if (tVar1) {
    __assert_fail("(!close(x, value_type(0))) && \"scale shouldn\'t be zero\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/yama-src/include/yama/matrix4x4.hpp"
                  ,0x8b,
                  "static matrix4x4_t<T> yama::matrix4x4_t<float>::scaling(const value_type &, const value_type &, const value_type &) [T = float]"
                 );
  }
  local_50 = 0.0;
  tVar1 = close<float>(z_local,&local_50,&constants_t<float>::EPSILON);
  if (tVar1) {
    __assert_fail("(!close(y, value_type(0))) && \"scale shouldn\'t be zero\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/yama-src/include/yama/matrix4x4.hpp"
                  ,0x8c,
                  "static matrix4x4_t<T> yama::matrix4x4_t<float>::scaling(const value_type &, const value_type &, const value_type &) [T = float]"
                 );
  }
  local_54 = 0.0;
  tVar1 = close<float>(local_48,&local_54,&constants_t<float>::EPSILON);
  if (tVar1) {
    __assert_fail("(!close(z, value_type(0))) && \"scale shouldn\'t be zero\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/yama-src/include/yama/matrix4x4.hpp"
                  ,0x8d,
                  "static matrix4x4_t<T> yama::matrix4x4_t<float>::scaling(const value_type &, const value_type &, const value_type &) [T = float]"
                 );
  }
  local_58 = 0.0;
  local_5c = 0.0;
  local_60 = 0.0;
  local_64 = 0.0;
  local_68 = 0.0;
  local_6c = 0.0;
  local_70 = 0.0;
  local_74 = 0.0;
  local_78 = 0.0;
  local_7c = 0.0;
  local_80 = 0.0;
  local_84 = 0.0;
  local_88 = 1.0;
  columns(__return_storage_ptr__,y_local,&local_58,&local_5c,&local_60,&local_64,z_local,&local_68,
          &local_6c,&local_70,&local_74,local_48,&local_78,&local_7c,&local_80,&local_84,&local_88);
  return __return_storage_ptr__;
}

Assistant:

static constexpr matrix4x4_t scaling(const value_type& x, const value_type& y, const value_type& z)
    {
        YAMA_ASSERT_WARN(!close(x, value_type(0)), "scale shouldn't be zero");
        YAMA_ASSERT_WARN(!close(y, value_type(0)), "scale shouldn't be zero");
        YAMA_ASSERT_WARN(!close(z, value_type(0)), "scale shouldn't be zero");
        return columns(
            x, 0, 0, 0,
            0, y, 0, 0,
            0, 0, z, 0,
            0, 0, 0, 1
        );
    }